

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O3

S2Cap * __thiscall
S2MinDistanceEdgeTarget::GetCapBound(S2Cap *__return_storage_ptr__,S2MinDistanceEdgeTarget *this)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double length2;
  double local_28;
  ostream *local_20;
  
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_28,&this->a_,&this->b_);
  dVar1 = local_28 * -0.25 + 1.0;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  length2 = (local_28 * 0.5) / (dVar1 + 1.0);
  dVar1 = (this->a_).c_[2] + (this->b_).c_[2];
  if (4.0 <= length2) {
    length2 = 4.0;
  }
  dVar4 = (this->b_).c_[0] + (this->a_).c_[0];
  dVar5 = (this->b_).c_[1] + (this->a_).c_[1];
  dVar3 = SQRT(dVar5 * dVar5 + dVar4 * dVar4 + dVar1 * dVar1);
  dVar3 = (double)(~-(ulong)(dVar3 != 0.0) & (ulong)dVar3 |
                  (ulong)(1.0 / dVar3) & -(ulong)(dVar3 != 0.0));
  S1ChordAngle::S1ChordAngle(&__return_storage_ptr__->radius_,length2);
  (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_002bb758;
  (__return_storage_ptr__->center_).c_[0] = dVar3 * dVar4;
  (__return_storage_ptr__->center_).c_[1] = dVar3 * dVar5;
  (__return_storage_ptr__->center_).c_[2] = dVar3 * dVar1;
  bVar2 = S2::IsUnitLength(&__return_storage_ptr__->center_);
  if ((bVar2) && ((__return_storage_ptr__->radius_).length2_ <= 4.0)) {
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.h"
             ,0xf5,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(local_20,"Check failed: is_valid() ",0x19);
  abort();
}

Assistant:

S2Cap S2MinDistanceEdgeTarget::GetCapBound() {
  // The following computes a radius equal to half the edge length in an
  // efficient and numerically stable way.
  double d2 = S1ChordAngle(a_, b_).length2();
  double r2 = (0.5 * d2) / (1 + sqrt(1 - 0.25 * d2));
  return S2Cap((a_ + b_).Normalize(), S1ChordAngle::FromLength2(r2));
}